

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool __thiscall ON_Extrusion::SetMiterPlaneNormal(ON_Extrusion *this,ON_3dVector N,int end)

{
  bool bVar1;
  
  if (1 < (uint)end) {
    return false;
  }
  bVar1 = ON_3dVector::IsValid(&N);
  if (((!bVar1) || (N.z <= 0.015625)) ||
     ((bVar1 = ON_3dVector::IsUnitVector(&N), !bVar1 && (bVar1 = ON_3dVector::Unitize(&N), !bVar1)))
     ) {
    bVar1 = ON_3dVector::IsZero(&N);
    if ((!bVar1) && (bVar1 = ON_3dVector::operator==(&ON_3dVector::UnsetVector,&N), !bVar1)) {
      return false;
    }
    this->m_bHaveN[(uint)end] = false;
  }
  else {
    if ((ABS(N.x) <= 1.490116119385e-08) && (ABS(N.y) <= 1.490116119385e-08)) {
      ON_3dVector::Set(&N,0.0,0.0,1.0);
    }
    this->m_N[(uint)end].z = N.z;
    this->m_N[(uint)end].x = N.x;
    this->m_N[(uint)end].y = N.y;
    this->m_bHaveN[(uint)end] = N.z != 1.0;
  }
  return true;
}

Assistant:

bool ON_Extrusion::SetMiterPlaneNormal(ON_3dVector N, int end)
{
  bool rc = false;
  if ( end >= 0 && end <= 1 )
  {
    if (    N.IsValid() 
         && N.z > ON_Extrusion::m_Nz_min
         && (N.IsUnitVector() || N.Unitize())
       )
    {
      if (fabs(N.x) <= ON_SQRT_EPSILON && fabs(N.y) <= ON_SQRT_EPSILON)
        N.Set(0.0,0.0,1.0);
      m_N[end] = N;
      m_bHaveN[end] = (N.z != 1.0);
      rc = true;
    }
    else if ( N.IsZero() || ON_3dVector::UnsetVector == N )
    {
      m_bHaveN[end] = false;
      rc = true;
    }
  }
  return rc;
}